

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

float_t __thiscall djb::microfacet::vndf(microfacet *this,vec3 *wm,vec3 *wi,args *args)

{
  float_t fVar1;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar2;
  float fVar3;
  undefined4 in_XMM1_Db;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  float fVar7;
  vec3 vVar8;
  undefined8 local_78;
  float local_70;
  vec3 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  float local_38;
  undefined4 uStack_34;
  undefined1 local_28 [16];
  undefined1 auVar5 [16];
  
  vVar8 = djb::operator*(&args->mtra,wm);
  fVar2 = vVar8.z;
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._0_8_ = vVar8._0_8_;
  local_28._12_4_ = extraout_XMM0_Dd;
  vVar8 = djb::operator*(&args->minv,wi);
  local_68.z = vVar8.z;
  local_68._0_8_ = vVar8._0_8_;
  vVar8 = normalize(&local_68);
  local_70 = vVar8.z;
  local_78 = vVar8._0_8_;
  local_38 = local_70 * fVar2 + vVar8.x * (float)local_28._0_4_ + (float)local_28._4_4_ * vVar8.y;
  fVar1 = 0.0;
  if (0.0 < local_38) {
    fVar7 = fVar2 * fVar2 +
            (float)local_28._0_4_ * (float)local_28._0_4_ +
            (float)local_28._4_4_ * (float)local_28._4_4_;
    if (fVar7 <= 0.0) {
      __assert_fail("x > T(0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                    ,0x259,"T djb::inversesqrt(const T &) [T = float]");
    }
    fVar3 = 1.0 / SQRT(fVar7);
    local_58 = ZEXT416((uint)(fVar7 * fVar7));
    local_48 = ZEXT416((uint)args->detm);
    local_68.z = fVar2 * fVar3;
    local_68.y = (float)local_28._4_4_ * fVar3;
    local_68.x = (float)local_28._0_4_ * fVar3;
    uStack_34 = in_XMM1_Db;
    (*(this->super_brdf)._vptr_brdf[0xb])(this);
    (*(this->super_brdf)._vptr_brdf[10])(this,&local_78);
    auVar5._0_8_ = local_48._0_8_;
    auVar5._8_4_ = local_48._4_4_;
    auVar5._12_4_ = uStack_34;
    auVar4._8_8_ = auVar5._8_8_;
    auVar4._0_4_ = local_48._0_4_;
    auVar4._4_4_ = local_38 * extraout_XMM0_Da;
    auVar6._4_4_ = extraout_XMM0_Da_00;
    auVar6._0_4_ = local_58._0_4_;
    auVar6._8_4_ = local_58._4_4_;
    auVar6._12_4_ = extraout_XMM0_Db;
    auVar6 = divps(auVar4,auVar6);
    fVar1 = (float_t)(-(uint)(0.0 < extraout_XMM0_Da) & (uint)(auVar6._4_4_ * auVar6._0_4_));
  }
  return fVar1;
}

Assistant:

float_t
microfacet::vndf(const vec3 &wm, const vec3 &wi, const args &args) const
{
	vec3 wm_std = args.mtra * wm;
	vec3 wi_std = normalize(args.minv * wi);
	float_t dpd = dot(wm_std, wi_std);

	if (dpd > 0) {
		float_t nrmsqr = dot(wm_std, wm_std);
		float_t nrm = inversesqrt(nrmsqr);
		float_t dwdw = args.detm / sqr(nrmsqr);
		float_t D = ndf_std(wm_std * nrm);
		float_t sigma = sigma_std(wi_std);

		return D > 0 ? dpd * D / sigma * dwdw : 0;
	}

	return 0;
}